

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

string * __thiscall
ot::commissioner::coap::CodeToString_abi_cxx11_
          (string *__return_storage_ptr__,coap *this,Code aCode)

{
  char *pcVar1;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  switch((int)this) {
  case 0x80:
    pcVar1 = "BAD_REQUEST";
    break;
  case 0x81:
    pcVar1 = "UNAUTHORIZED";
    break;
  case 0x82:
    pcVar1 = "BAD_OPTION";
    break;
  case 0x83:
    pcVar1 = "FORBIDDEN";
    break;
  case 0x84:
    pcVar1 = "NOT_FOUND";
    break;
  case 0x85:
    pcVar1 = "METHOD_NOT_ALLOWED";
    break;
  case 0x86:
    pcVar1 = "NOT_ACCEPTABLE";
    break;
  case 0x87:
  case 0x88:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x8e:
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x95:
  case 0x96:
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9e:
  case 0x9f:
switchD_0014b2cd_caseD_87:
    pcVar1 = "UNKNOWN";
    break;
  case 0x8c:
    pcVar1 = "PRECONDITIONFAILED";
    break;
  case 0x8d:
    pcVar1 = "REQUEST_TOOL_LARGE";
    break;
  case 0x8f:
    pcVar1 = "UNSUPPORTED_FORMAT";
    break;
  case 0xa0:
    pcVar1 = "INTERNAL_ERROR";
    break;
  case 0xa1:
    pcVar1 = "NOT_IMPLEMENTED";
    break;
  case 0xa2:
    pcVar1 = "BAD_GATEWAY";
    break;
  case 0xa3:
    pcVar1 = "SERVICE_UNAVAILABLE";
    break;
  case 0xa4:
    pcVar1 = "BATEWAY_TIMEOUT";
    break;
  case 0xa5:
    pcVar1 = "PROXY_NOT_SUPPORTED";
    break;
  default:
    switch((ulong)this & 0xffffffff) {
    case 0:
      pcVar1 = "EMPTY";
      break;
    case 1:
      pcVar1 = "GET";
      break;
    case 2:
      pcVar1 = "POST";
      break;
    case 3:
      pcVar1 = "PUT";
      break;
    case 4:
      pcVar1 = "DELETE";
      break;
    default:
      switch((int)this) {
      case 0x41:
        pcVar1 = "CREATED";
        break;
      case 0x42:
        pcVar1 = "DELETED";
        break;
      case 0x43:
        pcVar1 = "VALID";
        break;
      case 0x44:
        pcVar1 = "CHANGED";
        break;
      case 0x45:
        pcVar1 = "CONTENT";
        break;
      default:
        goto switchD_0014b2cd_caseD_87;
      }
    }
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_replace((ulong)&local_30,0,(char *)0x0,(ulong)pcVar1);
  std::operator+(__return_storage_ptr__,"CoAP::",&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CodeToString(Code aCode)
{
    std::string str;

    switch (aCode)
    {
    /*
     * Methods (0.XX).
     */
    case Code::kEmpty:
        str = "EMPTY";
        break;
    case Code::kGet:
        str = "GET";
        break;
    case Code::kPost:
        str = "POST";
        break;

    case Code::kPut:
        str = "PUT";
        break;

    case Code::kDelete:
        str = "DELETE";
        break;

    /*
     * Success (2.XX).
     */
    case Code::kCreated:
        str = "CREATED";
        break;
    case Code::kDeleted:
        str = "DELETED";
        break;
    case Code::kValid:
        str = "VALID";
        break;
    case Code::kChanged:
        str = "CHANGED";
        break;
    case Code::kContent:
        str = "CONTENT";
        break;

    /*
     * Client side errors (4.XX).
     */
    case Code::kBadRequest:
        str = "BAD_REQUEST";
        break;
    case Code::kUnauthorized:
        str = "UNAUTHORIZED";
        break;
    case Code::kBadOption:
        str = "BAD_OPTION";
        break;
    case Code::kForBidden:
        str = "FORBIDDEN";
        break;
    case Code::kNotFound:
        str = "NOT_FOUND";
        break;
    case Code::kMethodNotAllowed:
        str = "METHOD_NOT_ALLOWED";
        break;
    case Code::kNotAcceptable:
        str = "NOT_ACCEPTABLE";
        break;
    case Code::kPreconditionFailed:
        str = "PRECONDITIONFAILED";
        break;
    case Code::kRequestTooLarge:
        str = "REQUEST_TOOL_LARGE";
        break;
    case Code::kUnsupportedFormat:
        str = "UNSUPPORTED_FORMAT";
        break;

    /*
     * Server side errors (5.XX).
     */
    case Code::kInternalError:
        str = "INTERNAL_ERROR";
        break;
    case Code::kNotImplemented:
        str = "NOT_IMPLEMENTED";
        break;
    case Code::kBadGateway:
        str = "BAD_GATEWAY";
        break;
    case Code::kServiceUnavailable:
        str = "SERVICE_UNAVAILABLE";
        break;
    case Code::kGatewayTimeout:
        str = "BATEWAY_TIMEOUT";
        break;
    case Code::kProxyNotSupported:
        str = "PROXY_NOT_SUPPORTED";
        break;
    default:
        str = "UNKNOWN";
        break;
    }

    return "CoAP::" + str;
}